

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::strtonum::parse<long>(strtonum *this,longlong *value)

{
  int *piVar1;
  longlong lVar2;
  bool bVar3;
  char *endptr;
  char *local_28;
  
  local_28 = (char *)0x0;
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = parse_integral(this,&local_28);
  *value = lVar2;
  if ((*piVar1 == 0) && (this->m_start < this->m_end)) {
    bVar3 = local_28 == this->m_end;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool parse(T& value, /*is_integral=*/std::true_type) const
				{
					char* endptr = nullptr;
					errno = 0; // these are thread-local
					const auto x = parse_integral(&endptr, std::is_signed<T>());

					// called right overload?
					static_assert(std::is_signed<T>() == std::is_signed<decltype(x)>(), "");

					value = static_cast<T>(x);

					return (x == static_cast<decltype(x)>(value)) // x fits into destination T
						and (x < 0) == (value < 0)             // preserved sign
															   //and ((x != 0) or is_integral())        // strto[u]ll did nto fail
						and (errno == 0)                       // strto[u]ll did not overflow
						and (m_start < m_end)                  // token was not empty
						and (endptr == m_end);                 // parsed entire token exactly
				}